

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O1

Expression * __thiscall slang::ast::PortConnection::getExpression(PortConnection *this)

{
  PortSymbol *this_00;
  Compilation *this_01;
  Type *arg;
  bool bVar1;
  ArgumentDirection direction;
  Expression *pEVar2;
  Type *type;
  Diagnostic *this_02;
  bitmask<slang::ast::AssignFlags> flags;
  Type *argType;
  ulong uVar3;
  ulong uVar4;
  LookupLocation LVar5;
  pair<slang::ast::ArgumentDirection,_const_slang::ast::Type_*> pVar6;
  SourceRange sourceRange;
  SourceRange assignmentRange;
  SourceRange assignmentRange_00;
  Expression *e;
  ASTContext context;
  undefined1 in_stack_ffffffffffffff80;
  undefined6 in_stack_ffffffffffffff81;
  Type *local_78;
  InstanceSymbolBase *local_70;
  ASTContext local_68;
  
  if ((this->expr == (Expression *)0x0) &&
     (this_00 = (PortSymbol *)this->port, (this_00->super_Symbol).kind != InterfacePort)) {
    if ((this->field_4).exprSyntax == (ExpressionSyntax *)0x0 &&
        this->connectedSymbol == (Symbol *)0x0) {
      if (this->useDefault != true) goto LAB_0030919e;
      pEVar2 = PortSymbol::getInitializer(this_00);
    }
    else {
      local_70 = (InstanceSymbolBase *)
                 ((this_00->super_Symbol).parentScope)->thisSym[1].originatingSyntax;
      LVar5 = LookupLocation::after((Symbol *)local_70);
      uVar4 = 0x20;
      if ((((PortSymbol *)this->port)->super_Symbol).kind == Port) {
        bVar1 = PortSymbol::isNetPort((PortSymbol *)this->port);
        uVar4 = (ulong)((uint)bVar1 << 0x1f) | 0x20;
      }
      pVar6 = getDirAndType(this->port);
      argType = pVar6.second;
      direction = pVar6.first;
      uVar3 = 0;
      if (direction - Out < 2) {
        uVar3 = (ulong)(direction == InOut) << 0x26 | 0x100000;
      }
      local_68.flags.m_bits =
           (ulong)(*(byte *)(*(long *)&local_70[1].super_Symbol + 0x88) & 2) << 0x2b | uVar3 | uVar4
      ;
      local_68.instanceOrProc = (Symbol *)0x0;
      local_68.firstTempVar = (TempVarSymbol *)0x0;
      local_68.randomizeDetails = (RandomizeDetails *)0x0;
      local_68.assertionInstance = (AssertionInstanceDetails *)0x0;
      local_68.scope.ptr = LVar5.scope;
      local_68.lookupIndex = LVar5.index;
      ASTContext::setInstance(&local_68,local_70);
      if (this->connectedSymbol != (Symbol *)0x0) {
        sourceRange.endLoc = (SourceLocation)0x0;
        sourceRange.startLoc = (this->field_4).implicitNameRange.endLoc;
        local_78 = (Type *)ValueExpressionBase::fromSymbol
                                     ((ValueExpressionBase *)&local_68,
                                      (ASTContext *)this->connectedSymbol,(Symbol *)0x0,
                                      (HierarchicalReference *)(this->field_4).exprSyntax,
                                      sourceRange,false,(bool)in_stack_ffffffffffffff80);
        flags.m_bits = (direction == Out) << 3;
        bVar1 = Type::isEquivalent((Type *)(local_78->super_Symbol).name._M_len,argType);
        if (!bVar1) {
          this_01 = (local_68.scope.ptr)->compilation;
          arg = (Type *)(local_78->super_Symbol).name._M_len;
          if (direction != Ref) {
            if (direction == In) {
              assignmentRange.endLoc = (SourceLocation)0x0;
              assignmentRange.startLoc = (this->field_4).implicitNameRange.endLoc;
              local_78 = (Type *)Expression::convertAssignment
                                           ((Expression *)&local_68,(ASTContext *)argType,local_78,
                                            (Expression *)(this->field_4).exprSyntax,assignmentRange
                                            ,(Expression **)0x0,
                                            (bitmask<slang::ast::AssignFlags> *)
                                            CONCAT17(flags.m_bits,
                                                     CONCAT61(in_stack_ffffffffffffff81,
                                                              in_stack_ffffffffffffff80)));
            }
            else {
              type = (Type *)BumpAllocator::
                             emplace<slang::ast::EmptyArgumentExpression,slang::ast::Type_const&,slang::SourceRange_const&>
                                       (&this_01->super_BumpAllocator,argType,
                                        &(this->field_4).implicitNameRange);
              assignmentRange_00.endLoc = (SourceLocation)&local_78;
              assignmentRange_00.startLoc = (this->field_4).implicitNameRange.endLoc;
              Expression::convertAssignment
                        ((Expression *)&local_68,(ASTContext *)(local_78->super_Symbol).name._M_len,
                         type,(Expression *)(this->field_4).exprSyntax,assignmentRange_00,
                         (Expression **)&stack0xffffffffffffff87,
                         (bitmask<slang::ast::AssignFlags> *)
                         CONCAT17(flags.m_bits,
                                  CONCAT61(in_stack_ffffffffffffff81,in_stack_ffffffffffffff80)));
            }
          }
          if (direction == Ref || (local_70->arrayPath)._M_extent._M_extent_value == 0) {
            bVar1 = Expression::bad((Expression *)local_78);
            if (!bVar1) {
              if (argType->canonical == (Type *)0x0) {
                Type::resolveCanonical(argType);
              }
              if ((argType->canonical->super_Symbol).kind != ErrorType) {
                this_02 = ASTContext::addDiag(&local_68,(DiagCode)0xf00006,
                                              (this->field_4).implicitNameRange);
                Diagnostic::operator<<(this_02,this->port->name);
                ast::operator<<(this_02,argType);
                ast::operator<<(this_02,arg);
                if (direction == Ref) {
                  local_78 = (Type *)BumpAllocator::
                                     emplace<slang::ast::InvalidExpression,slang::ast::Expression*&,slang::ast::Type_const&>
                                               (&this_01->super_BumpAllocator,
                                                (Expression **)&local_78,this_01->errorType);
                }
              }
            }
          }
        }
        this->expr = (Expression *)local_78;
        bVar1 = Expression::bad((Expression *)local_78);
        if (!bVar1) {
          Expression::checkConnectionDirection
                    (this->expr,direction,&local_68,(this->expr->sourceRange).startLoc,flags);
        }
        goto LAB_0030919e;
      }
      pEVar2 = Expression::bindArgument
                         (argType,direction,(bitmask<slang::ast::VariableFlags>)0x0,
                          (this->field_4).exprSyntax,&local_68);
    }
    this->expr = pEVar2;
  }
LAB_0030919e:
  return this->expr;
}

Assistant:

const Expression* PortConnection::getExpression() const {
    if (expr || port.kind == SymbolKind::InterfacePort)
        return expr;

    if (connectedSymbol || exprSyntax) {
        auto& parentInstance = getParentInstance();
        auto ll = LookupLocation::after(parentInstance);
        auto scope = ll.getScope();
        SLANG_ASSERT(scope);

        const bool isNetPort = port.kind == SymbolKind::Port && port.as<PortSymbol>().isNetPort();
        auto [direction, type] = getDirAndType(port);

        bitmask<ASTFlags> flags = ASTFlags::NonProcedural;
        if (isNetPort)
            flags |= ASTFlags::AllowInterconnect;

        if (direction == ArgumentDirection::Out || direction == ArgumentDirection::InOut) {
            flags |= ASTFlags::LValue;
            if (direction == ArgumentDirection::InOut)
                flags |= ASTFlags::LAndRValue;
        }

        if (parentInstance.body.flags.has(InstanceFlags::FromBind))
            flags |= ASTFlags::BindInstantiation;

        ASTContext context(*scope, ll, flags);
        context.setInstance(parentInstance);

        if (connectedSymbol) {
            Expression* e = &ValueExpressionBase::fromSymbol(context, *connectedSymbol, nullptr,
                                                             implicitNameRange);

            bitmask<AssignFlags> assignFlags;
            if (direction == ArgumentDirection::Out)
                assignFlags = AssignFlags::OutputPort;

            if (!e->type->isEquivalent(*type)) {
                auto& comp = context.getCompilation();
                auto exprType = e->type;
                if (direction == ArgumentDirection::In) {
                    e = &Expression::convertAssignment(context, *type, *e, implicitNameRange);
                }
                else if (direction != ArgumentDirection::Ref) {
                    auto rhs = comp.emplace<EmptyArgumentExpression>(*type, implicitNameRange);
                    Expression::convertAssignment(context, *e->type, *rhs, implicitNameRange, &e,
                                                  &assignFlags);
                }

                // We should warn for this case unless convertAssignment already issued an error,
                // or if we're in an instance array unwrapping case.
                if ((parentInstance.arrayPath.empty() || direction == ArgumentDirection::Ref) &&
                    !e->bad() && !type->isError()) {
                    auto& diag = context.addDiag(diag::ImplicitNamedPortTypeMismatch,
                                                 implicitNameRange);
                    diag << port.name;
                    diag << *type;
                    diag << *exprType;

                    // There's no way to represent this expression for the ref case.
                    if (direction == ArgumentDirection::Ref)
                        e = comp.emplace<InvalidExpression>(e, comp.getErrorType());
                }
            }

            expr = e;
            if (!expr->bad()) {
                Expression::checkConnectionDirection(*expr, direction, context,
                                                     expr->sourceRange.start(), assignFlags);
            }
        }
        else {
            expr = &Expression::bindArgument(*type, direction, {}, *exprSyntax, context);
        }
    }
    else if (useDefault) {
        auto& ps = port.as<PortSymbol>();
        expr = ps.getInitializer();
    }

    return expr;
}